

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage2RunnerNonRecursive.hpp
# Opt level: O2

void Centaurus::NonRecursiveReductionRunner::push_start_marker
               (CSTMarker *marker,
               vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_> *starts,
               vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
               *tags)

{
  StackEntryTag local_14;
  
  std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>::
  emplace_back<Centaurus::detail::StackEntryTag>(tags,&local_14);
  std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>::
  emplace_back<Centaurus::CSTMarker_const&>
            ((vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>> *)starts,marker);
  return;
}

Assistant:

static void push_start_marker(const CSTMarker& marker, std::vector<CSTMarker>& starts, std::vector<detail::StackEntryTag>& tags)
  {
    tags.emplace_back(detail::StackEntryTag::START_MARKER);
    starts.emplace_back(marker);
  }